

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::PathPtr::evalWin32(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  char cVar1;
  String *pSVar2;
  char *pcVar3;
  RemoveConst<kj::String> *pRVar4;
  String *pSVar5;
  Path *pPVar6;
  Vector<kj::String> *parts;
  long lVar7;
  char *size;
  char *value;
  size_t newSize;
  undefined1 fromApi;
  undefined8 in_R9;
  long lVar8;
  size_t sVar9;
  StringPtr path;
  Vector<kj::String> newParts;
  Vector<kj::String> local_78;
  size_t local_58;
  Path *local_50;
  String local_48;
  
  local_58 = pathText.content.size_;
  parts = (Vector<kj::String> *)pathText.content.ptr;
  if ((Vector<kj::String> *)((long)parts + (local_58 - 1)) == parts) {
    lVar8 = 1;
  }
  else {
    lVar8 = 1;
    lVar7 = 0;
    do {
      cVar1 = *(char *)((long)&(parts->builder).ptr + lVar7);
      lVar8 = lVar8 + (ulong)(cVar1 == '\\' || cVar1 == '/');
      lVar7 = lVar7 + 1;
    } while (local_58 - 1 != lVar7);
  }
  sVar9 = lVar8 + (this->parts).size_;
  local_50 = __return_storage_ptr__;
  local_78.builder.ptr =
       (String *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x18,0,sVar9,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  fromApi = (undefined1)in_R9;
  local_78.builder.endPtr = local_78.builder.ptr + sVar9;
  local_78.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  sVar9 = (this->parts).size_;
  local_78.builder.pos = local_78.builder.ptr;
  if (sVar9 != 0) {
    pSVar2 = (this->parts).ptr;
    lVar8 = 0;
    do {
      pcVar3 = *(char **)((long)&(pSVar2->content).size_ + lVar8);
      value = pcVar3;
      if (pcVar3 != (char *)0x0) {
        value = *(char **)((long)&(pSVar2->content).ptr + lVar8);
      }
      size = (char *)0x0;
      if (pcVar3 != (char *)0x0) {
        size = pcVar3 + -1;
      }
      heapString(&local_48,value,(size_t)size);
      if (local_78.builder.pos == local_78.builder.endPtr) {
        newSize = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_78.builder.endPtr == local_78.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::String>::setCapacity(&local_78,newSize);
      }
      fromApi = (undefined1)in_R9;
      ((local_78.builder.pos)->content).ptr = local_48.content.ptr;
      ((local_78.builder.pos)->content).size_ = local_48.content.size_;
      ((local_78.builder.pos)->content).disposer = local_48.content.disposer;
      local_78.builder.pos = local_78.builder.pos + 1;
      lVar8 = lVar8 + 0x18;
    } while (sVar9 * 0x18 != lVar8);
  }
  pPVar6 = local_50;
  path.content.size_ = 0;
  path.content.ptr = (char *)local_58;
  Path::evalWin32Impl(local_50,(Path *)&local_78,parts,path,(bool)fromApi);
  pSVar5 = local_78.builder.endPtr;
  pRVar4 = local_78.builder.pos;
  pSVar2 = local_78.builder.ptr;
  if (local_78.builder.ptr != (String *)0x0) {
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_78.builder.endPtr = (String *)0x0;
    (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
              (local_78.builder.disposer,pSVar2,0x18,
               ((long)pRVar4 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ((long)pSVar5 - (long)pSVar2 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return pPVar6;
}

Assistant:

Path PathPtr::evalWin32(StringPtr pathText) const {
  Vector<String> newParts(parts.size() + Path::countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(heapString(p));
  return Path::evalWin32Impl(kj::mv(newParts), pathText);
}